

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::PotVecAccumulator::clear(PotVecAccumulator *this)

{
  Vector<double,_7U> potVecZero;
  double local_50;
  Vector<double,_7U> local_48;
  
  (this->super_BaseAccumulator).Count_ = 0;
  local_50 = 0.0;
  Vector<double,_7U>::Vector(&local_48,&local_50);
  Vector<double,_7U>::operator=(&this->Avg_,&local_48);
  Vector<double,_7U>::operator=(&this->Avg2_,&local_48);
  Vector<double,_7U>::operator=(&this->Val_,&local_48);
  Vector<double,_7U>::operator=(&this->Total_,&local_48);
  this->AvgLen_ = 0.0;
  this->AvgLen2_ = 0.0;
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      const Vector<RealType, N_INTERACTION_FAMILIES> potVecZero(0.0);
      Avg_     = potVecZero;
      Avg2_    = potVecZero;
      Val_     = potVecZero;
      Total_   = potVecZero;
      AvgLen_  = 0;
      AvgLen2_ = 0;
    }